

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_u32.cpp
# Opt level: O1

void T_UConverter_toUnicode_UTF32_BE_OFFSET_LOGIC(UConverterToUnicodeArgs *args,UErrorCode *err)

{
  byte bVar1;
  UConverter *pUVar2;
  byte *pbVar3;
  UChar *pUVar4;
  byte *pbVar5;
  int32_t *piVar6;
  UChar *pUVar7;
  uint uVar8;
  ulong uVar9;
  UChar UVar10;
  uint uVar11;
  int iVar12;
  int32_t *piVar13;
  long lVar14;
  
  pUVar2 = args->converter;
  pbVar5 = (byte *)args->source;
  pUVar7 = args->target;
  piVar6 = args->offsets;
  pbVar3 = (byte *)args->sourceLimit;
  pUVar4 = args->targetLimit;
  uVar8 = (uint)pUVar2->toULength;
  iVar12 = 0;
  if (pUVar4 <= pUVar7 || pUVar2->toULength < '\x01') goto LAB_002bbb35;
  pUVar2->toULength = '\0';
  uVar11 = pUVar2->toUnicodeStatus - 1;
  pUVar2->toUnicodeStatus = 0;
  iVar12 = 0;
  do {
    if (uVar8 < 4) {
      uVar9 = (ulong)uVar8;
      do {
        if (pbVar3 <= pbVar5) {
          pUVar2 = args->converter;
          pUVar2->toUnicodeStatus = uVar11 + 1;
          pUVar2->toULength = (int8_t)uVar9;
          goto LAB_002bbc16;
        }
        bVar1 = *pbVar5;
        uVar11 = uVar11 << 8 | (uint)bVar1;
        pbVar5 = pbVar5 + 1;
        pUVar2->toUBytes[uVar9] = bVar1;
        uVar9 = uVar9 + 1;
      } while (uVar9 != 4);
      uVar8 = 4;
    }
    if ((0x10ffff < uVar11) || ((uVar11 & 0x1ff800) == 0xd800)) {
      args->converter->toULength = (int8_t)uVar8;
      *err = U_ILLEGAL_CHAR_FOUND;
      break;
    }
    if (uVar11 < 0x10000) {
      *pUVar7 = (UChar)uVar11;
      pUVar7 = pUVar7 + 1;
      lVar14 = 4;
      piVar13 = piVar6;
    }
    else {
      *pUVar7 = (short)(uVar11 >> 10) + L'ퟀ';
      piVar13 = piVar6 + 1;
      *piVar6 = iVar12;
      UVar10 = (UChar)uVar11 & 0x3ffU | 0xdc00;
      if (pUVar4 <= pUVar7 + 1) {
        pUVar2 = args->converter;
        pUVar2->UCharErrorBuffer[0] = UVar10;
        pUVar2->UCharErrorBufferLength = '\x01';
        *err = U_BUFFER_OVERFLOW_ERROR;
        piVar6 = piVar13;
        pUVar7 = pUVar7 + 1;
        break;
      }
      pUVar7[1] = UVar10;
      pUVar7 = pUVar7 + 2;
      lVar14 = 8;
    }
    piVar6 = (int32_t *)((long)piVar6 + lVar14);
    *piVar13 = iVar12;
    iVar12 = iVar12 + uVar8;
LAB_002bbb35:
    if (pbVar3 <= pbVar5) break;
    uVar11 = 0;
    uVar8 = 0;
  } while (pUVar7 < pUVar4);
LAB_002bbc16:
  if (((pbVar5 < pbVar3) && (pUVar4 <= pUVar7)) && (*err < U_ILLEGAL_ARGUMENT_ERROR)) {
    *err = U_BUFFER_OVERFLOW_ERROR;
  }
  args->target = pUVar7;
  args->source = (char *)pbVar5;
  args->offsets = piVar6;
  return;
}

Assistant:

static void U_CALLCONV
T_UConverter_toUnicode_UTF32_BE_OFFSET_LOGIC(UConverterToUnicodeArgs * args,
                                             UErrorCode * err)
{
    const unsigned char *mySource = (unsigned char *) args->source;
    UChar *myTarget = args->target;
    int32_t *myOffsets = args->offsets;
    const unsigned char *sourceLimit = (unsigned char *) args->sourceLimit;
    const UChar *targetLimit = args->targetLimit;
    unsigned char *toUBytes = args->converter->toUBytes;
    uint32_t ch, i;
    int32_t offsetNum = 0;

    /* Restore state of current sequence */
    if (args->converter->toULength > 0 && myTarget < targetLimit) {
        i = args->converter->toULength;       /* restore # of bytes consumed */
        args->converter->toULength = 0;

        ch = args->converter->toUnicodeStatus - 1;/*Stores the previously calculated ch from a previous call*/
        args->converter->toUnicodeStatus = 0;
        goto morebytes;
    }

    while (mySource < sourceLimit && myTarget < targetLimit) {
        i = 0;
        ch = 0;
morebytes:
        while (i < sizeof(uint32_t)) {
            if (mySource < sourceLimit) {
                ch = (ch << 8) | (uint8_t)(*mySource);
                toUBytes[i++] = (char) *(mySource++);
            }
            else {
                /* stores a partially calculated target*/
                /* + 1 to make 0 a valid character */
                args->converter->toUnicodeStatus = ch + 1;
                args->converter->toULength = (int8_t) i;
                goto donefornow;
            }
        }

        if (ch <= MAXIMUM_UTF && !U_IS_SURROGATE(ch)) {
            /* Normal valid byte when the loop has not prematurely terminated (i < inBytes) */
            if (ch <= MAXIMUM_UCS2) {
                /* fits in 16 bits */
                *(myTarget++) = (UChar) ch;
                *(myOffsets++) = offsetNum;
            }
            else {
                /* write out the surrogates */
                *(myTarget++) = U16_LEAD(ch);
                *myOffsets++ = offsetNum;
                ch = U16_TRAIL(ch);
                if (myTarget < targetLimit)
                {
                    *(myTarget++) = (UChar)ch;
                    *(myOffsets++) = offsetNum;
                }
                else {
                    /* Put in overflow buffer (not handled here) */
                    args->converter->UCharErrorBuffer[0] = (UChar) ch;
                    args->converter->UCharErrorBufferLength = 1;
                    *err = U_BUFFER_OVERFLOW_ERROR;
                    break;
                }
            }
        }
        else {
            args->converter->toULength = (int8_t)i;
            *err = U_ILLEGAL_CHAR_FOUND;
            break;
        }
        offsetNum += i;
    }

donefornow:
    if (mySource < sourceLimit && myTarget >= targetLimit && U_SUCCESS(*err))
    {
        /* End of target buffer */
        *err = U_BUFFER_OVERFLOW_ERROR;
    }

    args->target = myTarget;
    args->source = (const char *) mySource;
    args->offsets = myOffsets;
}